

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int float64_unordered_quiet_mips64el(float64 a,float64 b,float_status *status)

{
  int iVar1;
  
  if (status->flush_inputs_to_zero != '\0') {
    if ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0) {
      status->float_exception_flags = status->float_exception_flags | 0x40;
      a = 0;
    }
    if ((b & 0xfffffffffffff) != 0 && (b & 0x7ff0000000000000) == 0) {
      status->float_exception_flags = status->float_exception_flags | 0x40;
      b = 0;
    }
  }
  if (((~a & 0x7ff0000000000000) == 0 && (a & 0xfffffffffffff) != 0) ||
     (iVar1 = 0, (b & 0xfffffffffffff) != 0 && (~b & 0x7ff0000000000000) == 0)) {
    if (status->snan_bit_is_one == '\0') {
      if (((a & 0x7ffffffffffff) != 0 && (a & 0x7ff8000000000000) == 0x7ff0000000000000) ||
         (iVar1 = 1, (b & 0x7ffffffffffff) != 0 && (b & 0x7ff8000000000000) == 0x7ff0000000000000))
      goto LAB_0091d7a5;
    }
    else {
      iVar1 = 1;
      if (0xffe < ((uint)(b >> 0x33) & 0xfff) || 0xffe < ((uint)(a >> 0x33) & 0xfff)) {
LAB_0091d7a5:
        status->float_exception_flags = status->float_exception_flags | 1;
        return 1;
      }
    }
  }
  return iVar1;
}

Assistant:

int float64_unordered_quiet(float64 a, float64 b, float_status *status)
{
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 1;
    }
    return 0;
}